

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Direction.cpp
# Opt level: O2

void __thiscall iDynTree::Direction::Direction(Direction *this,double *in_data,uint in_size)

{
  VectorFixSize<3U>::VectorFixSize(&this->super_Vector3,in_data,(ulong)in_size);
  Normalize(this,DEFAULT_TOL);
  return;
}

Assistant:

Direction::Direction(const double* in_data, const unsigned int in_size):
                 VectorFixSize< 3 >(in_data,in_size)
    {
        this->Normalize();
    }